

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path,bool skip_extensions)

{
  unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  *puVar1;
  char cVar2;
  undefined4 uVar3;
  char *pcVar4;
  void *pvVar5;
  DescriptorBuilder *pDVar6;
  FeatureSetDefaults *pFVar7;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  FieldDescriptor *innermost_field;
  const_iterator intermediate_fields_iter;
  Message *message;
  MaybeInitializedPtr __ptr;
  vector<int,_std::allocator<int>_> *k;
  bool bVar8;
  byte extraout_AL;
  byte bVar9;
  int iVar10;
  int iVar11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar12;
  Symbol this_00;
  UnknownFieldSet *pUVar13;
  LogMessage *this_01;
  Nonnull<const_char_*> pcVar14;
  undefined1 v1;
  UninterpretedOption *pUVar15;
  pointer pcVar16;
  size_type sVar17;
  bool bVar18;
  DescriptorBuilder *pDVar19;
  iterator iVar20;
  long *plVar21;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view str;
  string_view str_00;
  string_view str_01;
  Metadata MVar22;
  string_view relative_to;
  FieldDescriptor *field;
  string outstr;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  vector<int,_std::allocator<int>_> dest_path;
  int index;
  Descriptor *descriptor;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  FieldDescriptor *local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [40];
  string local_f8;
  const_iterator local_d8;
  iterator iStack_d0;
  FieldDescriptor **local_c8;
  Message *local_c0;
  undefined1 local_b8 [24];
  AlphaNum local_a0;
  undefined1 local_70 [8];
  MaybeInitializedPtr local_68;
  char *local_60;
  vector<int,_std::allocator<int>_> *local_38;
  
  pUVar15 = this->uninterpreted_option_;
  if ((pUVar15->field_0)._impl_.name_.super_RepeatedPtrFieldBase.current_size_ == 0) {
    if (skip_extensions) {
      return true;
    }
    pDVar19 = this->builder_;
    pcVar16 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar17 = (this->options_to_interpret_->element_name)._M_string_length;
    local_130._8_8_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__0,std::__cxx11::string>
    ;
LAB_001708c8:
    local_130._0_8_ = &local_a0;
    make_error.invoker_._0_4_ = (int)local_130._8_8_;
    make_error.ptr_.obj = (void *)local_130._0_8_;
    make_error.invoker_._4_4_ = 0;
    element_name._M_str = pcVar16;
    element_name._M_len = sVar17;
    AddError(pDVar19,element_name,&pUVar15->super_Message,OPTION_NAME,make_error);
    return false;
  }
  pVVar12 = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(pUVar15->field_0)._impl_.name_.super_RepeatedPtrFieldBase,0);
  iVar10 = std::__cxx11::string::compare
                     ((char *)((ulong)(pVVar12->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc));
  if (iVar10 == 0) {
    if (skip_extensions) {
      return true;
    }
    pDVar19 = this->builder_;
    pcVar16 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar17 = (this->options_to_interpret_->element_name)._M_string_length;
    pUVar15 = this->uninterpreted_option_;
    local_130._8_8_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__1,std::__cxx11::string>
    ;
    goto LAB_001708c8;
  }
  pVVar12 = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(this->uninterpreted_option_->field_0)._impl_.name_.
                        super_RepeatedPtrFieldBase,0);
  if ((pVVar12->field_0)._impl_.is_extension_ == skip_extensions) {
    return true;
  }
  pDVar19 = this->builder_;
  MVar22 = Message::GetMetadata(options);
  pcVar4 = ((MVar22.descriptor)->all_names_).payload_;
  name._M_len = (ulong)*(ushort *)(pcVar4 + 2);
  name._M_str = pcVar4 + ~name._M_len;
  v1 = 1;
  this_00 = FindSymbolNotEnforcingDeps(pDVar19,name,true);
  if ((this_00.ptr_)->symbol_type_ == '\x01') {
LAB_00170325:
    local_138 = (FieldDescriptor *)0x0;
    local_c8 = (FieldDescriptor **)0x0;
    local_d8._M_current = (FieldDescriptor **)0x0;
    iStack_d0._M_current = (FieldDescriptor **)0x0;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_c0 = options;
    local_70 = (undefined1  [8])this_00.ptr_;
    local_38 = src_path;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_b8,options_path);
    if (0 < *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10)) {
      iVar10 = 0;
      do {
        pDVar19 = this->builder_;
        (pDVar19->undefine_resolved_name_)._M_string_length = 0;
        *(pDVar19->undefine_resolved_name_)._M_dataplus._M_p = '\0';
        pVVar12 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                            (&(this->uninterpreted_option_->field_0)._impl_.name_.
                              super_RepeatedPtrFieldBase,iVar10);
        pvVar5 = (pVVar12->field_0)._impl_.name_part_.tagged_ptr_.ptr_;
        if (local_f8._M_string_length != 0) {
          local_130._0_8_ = (AlphaNum *)0x1;
          local_130._8_8_ = ".";
          absl::lts_20250127::StrAppend(&local_f8,(AlphaNum *)local_130);
        }
        pVVar12 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                            (&(this->uninterpreted_option_->field_0)._impl_.name_.
                              super_RepeatedPtrFieldBase,iVar10);
        plVar21 = (long *)((ulong)pvVar5 & 0xfffffffffffffffc);
        if ((pVVar12->field_0)._impl_.is_extension_ == true) {
          local_130._0_8_ = (AlphaNum *)0x1;
          local_130._8_8_ = "(";
          local_a0.piece_._M_str = (char *)*plVar21;
          local_a0.piece_._M_len = plVar21[1];
          local_68 = (MaybeInitializedPtr)0x1;
          local_60 = ")";
          absl::lts_20250127::StrAppend
                    (&local_f8,(AlphaNum *)local_130,&local_a0,(AlphaNum *)(local_70 + 8));
          pDVar19 = this->builder_;
          name_00._M_str = (char *)*plVar21;
          name_00._M_len = plVar21[1];
          relative_to._M_str = (this->options_to_interpret_->name_scope)._M_dataplus._M_p;
          relative_to._M_len = (this->options_to_interpret_->name_scope)._M_string_length;
          local_138 = (FieldDescriptor *)
                      LookupSymbol(pDVar19,name_00,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
          if (((SymbolBase *)local_138)->symbol_type_ == '\x02') goto LAB_001704dd;
          local_138 = (FieldDescriptor *)0x0;
LAB_00170959:
          pDVar19 = this->builder_;
          if (pDVar19->pool_->allow_unknown_ == true) {
LAB_00170965:
            bVar18 = true;
            AddWithoutInterpreting
                      ((OptionInterpreter *)pDVar19,this->uninterpreted_option_,local_c0);
            goto LAB_00170b63;
          }
          if ((pDVar19->undefine_resolved_name_)._M_string_length == 0) {
            local_130._0_8_ = &local_a0;
            local_130._8_8_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__3,std::__cxx11::string>
            ;
            make_error_04.invoker_._0_4_ = 0x17de2f;
            make_error_04.ptr_.obj = (void *)local_130._0_8_;
            make_error_04.invoker_._4_4_ = 0;
            element_name_04._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name_04._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            local_a0.piece_._M_len = (size_t)&local_f8;
            AddError(pDVar19,element_name_04,&this->uninterpreted_option_->super_Message,OPTION_NAME
                     ,make_error_04);
          }
          else {
            local_130._0_8_ = &local_a0;
            local_130._8_8_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,std::__cxx11::string>
            ;
            make_error_01.invoker_._0_4_ = 0x17dd0e;
            make_error_01.ptr_.obj = (void *)local_130._0_8_;
            make_error_01.invoker_._4_4_ = 0;
            element_name_01._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name_01._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            local_a0.piece_._M_len = (size_t)&local_f8;
            local_a0.piece_._M_str = (char *)this;
            AddError(pDVar19,element_name_01,&this->uninterpreted_option_->super_Message,OPTION_NAME
                     ,make_error_01);
          }
          goto LAB_00170b61;
        }
        local_130._8_8_ = *plVar21;
        local_130._0_8_ = plVar21[1];
        absl::lts_20250127::StrAppend(&local_f8,(AlphaNum *)local_130);
        name_01._M_str = (char *)*plVar21;
        name_01._M_len = plVar21[1];
        local_138 = Descriptor::FindFieldByName((Descriptor *)this_00.ptr_,name_01);
        pDVar19 = (DescriptorBuilder *)this_00.ptr_;
        this_00.ptr_ = (SymbolBase *)local_70;
        if (local_138 == (FieldDescriptor *)0x0) goto LAB_00170959;
LAB_001704dd:
        pDVar6 = (DescriptorBuilder *)local_138->containing_type_;
        if (pDVar6 != (DescriptorBuilder *)this_00.ptr_) {
          if ((pDVar6 != (DescriptorBuilder *)0x0) && (((ulong)pDVar6->pool_ & 0x100) != 0))
          goto LAB_00170965;
          local_a0.piece_._M_str = (char *)(&local_a0 + 1);
          local_130._0_8_ = &local_a0;
          local_130._8_8_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__4,std::__cxx11::string>
          ;
          make_error_00.invoker_._0_4_ = 0x17dea7;
          make_error_00.ptr_.obj = (void *)local_130._0_8_;
          make_error_00.invoker_._4_4_ = 0;
          element_name_00._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
          element_name_00._M_len = (this->options_to_interpret_->element_name)._M_string_length;
          local_a0.piece_._M_len = (size_t)&local_f8;
          AddError(this->builder_,element_name_00,&this->uninterpreted_option_->super_Message,
                   OPTION_NAME,make_error_00);
          goto LAB_00170b61;
        }
        local_130._0_4_ = local_138->number_;
        if (local_b8._8_8_ == local_b8._16_8_) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_b8,(iterator)local_b8._8_8_,
                     (int *)local_130);
        }
        else {
          *(int *)local_b8._8_8_ = local_138->number_;
          local_b8._8_8_ = local_b8._8_8_ + 4;
        }
        if (local_138->file_ == this->builder_->file_) {
          pVVar12 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                              (&(this->uninterpreted_option_->field_0)._impl_.name_.
                                super_RepeatedPtrFieldBase,0);
          iVar11 = std::__cxx11::string::compare
                             ((char *)((ulong)(pVVar12->field_0)._impl_.name_part_.tagged_ptr_.ptr_
                                      & 0xfffffffffffffffc));
          if ((iVar11 == 0) &&
             (pVVar12 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                  (&(this->uninterpreted_option_->field_0)._impl_.name_.
                                    super_RepeatedPtrFieldBase,0),
             (pVVar12->field_0)._impl_.is_extension_ == false)) {
            local_130._0_8_ = &local_a0;
            local_130._8_8_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__5,std::__cxx11::string>
            ;
            make_error_05.invoker_._0_4_ = 0x17df2e;
            make_error_05.ptr_.obj = (void *)local_130._0_8_;
            make_error_05.invoker_._4_4_ = 0;
            element_name_05._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name_05._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            local_a0.piece_._M_len = (size_t)&local_f8;
            AddError(this->builder_,element_name_05,&this->uninterpreted_option_->super_Message,
                     OPTION_NAME,make_error_05);
            goto LAB_00170b61;
          }
        }
        pUVar15 = this->uninterpreted_option_;
        iVar11 = (pUVar15->field_0)._impl_.name_.super_RepeatedPtrFieldBase.current_size_;
        if (iVar10 < iVar11 + -1) {
          if ((local_138->type_ & 0xfe) != 10) {
            local_130._0_8_ = &local_a0;
            local_130._8_8_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__6,std::__cxx11::string>
            ;
            make_error_02.invoker_._0_4_ = 0x17df8c;
            make_error_02.ptr_.obj = (void *)local_130._0_8_;
            make_error_02.invoker_._4_4_ = 0;
            element_name_02._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name_02._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            local_a0.piece_._M_len = (size_t)&local_f8;
            AddError(this->builder_,element_name_02,&pUVar15->super_Message,OPTION_NAME,
                     make_error_02);
            goto LAB_00170b61;
          }
          bVar9 = local_138->field_0x1;
          bVar18 = (bool)((bVar9 & 0x20) >> 5);
          if (0xbf < bVar9 != bVar18) {
            pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar18,0xbf < bVar9,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_130,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar14);
            goto LAB_00170bfc;
          }
          if ((bVar9 & 0x20) != 0) {
            local_130._0_8_ = &local_a0;
            local_130._8_8_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__7,std::__cxx11::string>
            ;
            make_error_03.invoker_._0_4_ = 0x17dfea;
            make_error_03.ptr_.obj = (void *)local_130._0_8_;
            make_error_03.invoker_._4_4_ = 0;
            element_name_03._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name_03._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            local_a0.piece_._M_len = (size_t)&local_f8;
            AddError(this->builder_,element_name_03,&pUVar15->super_Message,OPTION_NAME,
                     make_error_03);
            goto LAB_00170b61;
          }
          if (iStack_d0._M_current == local_c8) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_d8,iStack_d0,&local_138);
          }
          else {
            *iStack_d0._M_current = local_138;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          this_00.ptr_ = &FieldDescriptor::message_type(local_138)->super_SymbolBase;
          iVar11 = *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10);
          local_70 = (undefined1  [8])this_00.ptr_;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < iVar11);
    }
    iVar20._M_current = iStack_d0._M_current;
    intermediate_fields_iter._M_current = local_d8._M_current;
    innermost_field = local_138;
    bVar9 = local_138->field_0x1;
    v1 = (bVar9 & 0x20) >> 5;
    if (0xbf < bVar9 == (bool)v1) {
      if ((bVar9 & 0x20) == 0) {
        MVar22 = Message::GetMetadata(local_c0);
        pUVar13 = Reflection::GetUnknownFields(MVar22.reflection,local_c0);
        bVar18 = ExamineIfOptionIsSet
                           (this,intermediate_fields_iter,(const_iterator)iVar20._M_current,
                            innermost_field,&local_f8,pUVar13);
        if (!bVar18) {
LAB_00170b61:
          bVar18 = false;
          goto LAB_00170b63;
        }
      }
      local_68.p = operator_new(0x10);
      *(undefined8 *)local_68.p = 0;
      *(undefined8 *)((long)local_68.p + 8) = 0;
      bVar18 = SetOptionValue(this,local_138,(UnknownFieldSet *)local_68.p);
      if (bVar18) {
        if (iStack_d0._M_current != local_d8._M_current) {
          iVar20._M_current = iStack_d0._M_current;
          do {
            local_120._32_8_ = operator_new(0x10);
            *(undefined8 *)local_120._32_8_ = 0;
            *(undefined8 *)(local_120._32_8_ + 8) = 0;
            puVar1 = &((DescriptorPool *)((long)iVar20._M_current + -0x78))->
                      feature_set_defaults_spec_;
            pFVar7 = (((DescriptorPool *)((long)iVar20._M_current + -0x78))->
                     feature_set_defaults_spec_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>.
                     _M_head_impl;
            cVar2 = *(char *)((long)&(pFVar7->super_Message).super_MessageLite + 2);
            if (cVar2 == '\n') {
              pUVar13 = UnknownFieldSet::AddGroup
                                  ((UnknownFieldSet *)local_120._32_8_,
                                   *(int *)((long)&(pFVar7->super_Message).super_MessageLite + 4));
              UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_68.p);
            }
            else {
              if (cVar2 != '\v') {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_130,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                           ,0x25c5);
                str_01._M_str = "Invalid wire type for CPPTYPE_MESSAGE: ";
                str_01._M_len = 0x27;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          ((LogMessage *)local_130,str_01);
                local_a0.piece_._M_len =
                     CONCAT44(local_a0.piece_._M_len._4_4_,
                              (uint)*(byte *)((long)&(((((DescriptorPool *)
                                                        ((long)iVar20._M_current + -0x78))->
                                                       feature_set_defaults_spec_)._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                                                  .
                                                  super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>
                                                  ._M_head_impl)->super_Message).super_MessageLite +
                                             2));
                absl::lts_20250127::log_internal::LogMessage::
                operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                          ((LogMessage *)local_130,(Type *)&local_a0);
                goto LAB_00170bfc;
              }
              local_130._8_8_ = (slot_type *)0x0;
              local_120[0] = '\0';
              local_130._0_8_ = (AlphaNum *)(local_130 + 0x10);
              bVar8 = UnknownFieldSet::SerializeToString
                                ((UnknownFieldSet *)local_68.p,(string *)local_130);
              if (!bVar8) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                           ,0x25b6,"unknown_fields->SerializeToString(&outstr)");
                str._M_str = "Unexpected failure while serializing option submessage ";
                str._M_len = 0x37;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          ((LogMessage *)&local_a0,str);
                this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                    ((LogMessage *)&local_a0,&local_f8);
                str_00._M_str = "\".";
                str_00._M_len = 2;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          (this_01,str_00);
                absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_a0);
              }
              UnknownFieldSet::AddLengthDelimited<>
                        ((UnknownFieldSet *)local_120._32_8_,
                         *(int *)((long)&(((puVar1->_M_t).
                                           super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                                           .
                                           super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>
                                          ._M_head_impl)->super_Message).super_MessageLite + 4),
                         (string *)local_130);
              if ((AlphaNum *)local_130._0_8_ != (AlphaNum *)(local_130 + 0x10)) {
                operator_delete((void *)local_130._0_8_,CONCAT71(local_120._1_7_,local_120[0]) + 1);
              }
            }
            __ptr = local_68;
            local_68 = (MaybeInitializedPtr)local_120._32_8_;
            local_120._32_8_ = (MaybeInitializedPtr)0x0;
            if (((UnknownFieldSet *)__ptr.p != (UnknownFieldSet *)0x0) &&
               (std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                          ((default_delete<google::protobuf::UnknownFieldSet> *)(local_70 + 8),
                           (UnknownFieldSet *)__ptr.p), (void *)local_120._32_8_ != (void *)0x0)) {
              std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                        ((default_delete<google::protobuf::UnknownFieldSet> *)(local_120 + 0x20),
                         (UnknownFieldSet *)local_120._32_8_);
            }
            iVar20._M_current = (FieldDescriptor **)puVar1;
          } while (puVar1 != (unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                              *)local_d8._M_current);
        }
        message = local_c0;
        MVar22 = Message::GetMetadata(local_c0);
        pUVar13 = Reflection::MutableUnknownFields(MVar22.reflection,message);
        UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_68.p);
        k = local_38;
        bVar9 = local_138->field_0x1;
        bVar8 = (bool)((bVar9 & 0x20) >> 5);
        if (0xbf < bVar9 != bVar8) {
          pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar8,0xbf < bVar9,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_130,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar14);
          goto LAB_00170bfc;
        }
        if ((bVar9 & 0x20) != 0) {
          absl::lts_20250127::container_internal::
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
          ::try_emplace_impl<std::vector<int,std::allocator<int>>const&>
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>::iterator,_bool>
                      *)local_130,&this->repeated_option_counts_,
                     (vector<int,_std::allocator<int>_> *)local_b8);
          uVar3 = *(undefined4 *)(local_130._8_8_ + 0x18);
          *(undefined4 *)(local_130._8_8_ + 0x18) = uVar3 + ~kDeleted;
          local_a0.piece_._M_len = CONCAT44(local_a0.piece_._M_len._4_4_,uVar3);
          if (local_b8._8_8_ == local_b8._16_8_) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_b8,(iterator)local_b8._8_8_,
                       (int *)&local_a0);
          }
          else {
            *(undefined4 *)local_b8._8_8_ = uVar3;
            local_b8._8_8_ = local_b8._8_8_ + 4;
          }
        }
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
        ::try_emplace_impl<std::vector<int,std::allocator<int>>const&>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
                    *)local_130,&this->interpreted_paths_,k);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)(local_130._8_8_ + 0x18),
                   (vector<int,_std::allocator<int>_> *)local_b8);
      }
      if ((UnknownFieldSet *)local_68.p != (UnknownFieldSet *)0x0) {
        std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                  ((default_delete<google::protobuf::UnknownFieldSet> *)(local_70 + 8),
                   (UnknownFieldSet *)local_68.p);
      }
LAB_00170b63:
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      if (local_d8._M_current == (FieldDescriptor **)0x0) {
        return bVar18;
      }
      operator_delete(local_d8._M_current,(long)local_c8 - (long)local_d8._M_current);
      return bVar18;
    }
  }
  else {
    MVar22 = Message::GetMetadata(options);
    this_00.ptr_ = &(MVar22.descriptor)->super_SymbolBase;
    if ((DescriptorBuilder *)this_00.ptr_ != (DescriptorBuilder *)0x0) goto LAB_00170325;
    InterpretSingleOption((OptionInterpreter *)local_130);
    bVar9 = extraout_AL;
  }
  pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                      ((bool)v1,0xbf < bVar9,
                       "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar14);
LAB_00170bfc:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_130);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path, bool skip_extensions) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError(
        []() -> std::string { return "Option must have a name."; });
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError([]() -> std::string {
      return "Option must not use reserved name \"uninterpreted_option\".";
    });
  }

  if (skip_extensions == uninterpreted_option_->name(0).is_extension()) {
    // Allow feature and option interpretation to occur in two phases.  This is
    // necessary because features *are* options and need to be interpreted
    // before resolving them.  However, options can also *have* features
    // attached to them.
    return true;
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  ABSL_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (!debug_msg_name.empty()) {
      absl::StrAppend(&debug_msg_name, ".");
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      absl::StrAppend(&debug_msg_name, "(", name_part, ")");
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      absl::StrAppend(&debug_msg_name, name_part);
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" is resolved to \"(",
              builder_->undefine_resolved_name_,
              ")\", which is not defined. The innermost scope is searched "
              "first "
              "in name resolution. Consider using a leading '.'(i.e., \"(.",
              debug_msg_name.substr(1),
              "\") to start from the outermost scope.");
        });
      } else {
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" unknown. Ensure that your proto",
              " definition file imports the proto which defines the option.");
        });
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError([&] {
          return absl::StrCat("Option field \"", debug_msg_name,
                              "\" is not a field or extension of message \"",
                              descriptor->name(), "\".");
        });
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      // Special handling to prevent feature use in the same file as the
      // definition.
      // TODO Add proper support for cases where this can work.
      if (field->file() == builder_->file_ &&
          uninterpreted_option_->name(0).name_part() == "features" &&
          !uninterpreted_option_->name(0).is_extension()) {
        return AddNameError([&] {
          return absl::StrCat(
              "Feature \"", debug_msg_name,
              "\" can't be used in the same file it's defined in.");
        });
      }

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError([&] {
            return absl::StrCat("Option \"", debug_msg_name,
                                "\" is an atomic type, not a message.");
          });
        } else if (field->is_repeated()) {
          return AddNameError([&] {
            return absl::StrCat("Option field \"", debug_msg_name,
                                "\" is a repeated message. Repeated message "
                                "options must be initialized using an "
                                "aggregate value.");
          });
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        std::string outstr;
        ABSL_CHECK(unknown_fields->SerializeToString(&outstr))
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        parent_unknown_fields->AddLengthDelimited((*iter)->number(),
                                                  std::move(outstr));
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                        << (*iter)->type();
        return false;
    }
    unknown_fields = std::move(parent_unknown_fields);
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}